

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O1

void __thiscall autoSimplification_power2_Test::TestBody(autoSimplification_power2_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> ex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _func_int **message;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar2;
  double in_XMM1_Qa;
  ExprPtr EVar3;
  AssertionResult gtest_ar;
  ExprPtr e;
  ExprPtr x;
  ExprPtr f1o3;
  ExprPtr f1o2;
  undefined1 local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  string local_90;
  AssertHelper local_70;
  long *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  long local_58 [2];
  Expr *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  local_28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  local_20->_M_use_count = 1;
  local_20->_M_weak_count = 1;
  local_20->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
  local_28 = local_20 + 1;
  local_20[1]._vptr__Sp_counted_base = (_func_int **)0x200000001;
  *(undefined1 *)&local_20[4]._M_use_count = 1;
  local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  local_30->_M_use_count = 1;
  local_30->_M_weak_count = 1;
  local_30->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
  local_38 = local_30 + 1;
  local_30[1]._vptr__Sp_counted_base = (_func_int **)0x300000001;
  *(undefined1 *)&local_30[4]._M_use_count = 1;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"x","");
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_68,(long)&local_60->_vptr__Sp_counted_base + (long)local_68);
  local_48 = (Expr *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mathiu::impl::Expr_const,std::allocator<mathiu::impl::Expr>,mathiu::impl::Symbol>
            (&local_40,&local_48,(allocator<mathiu::impl::Expr> *)local_a0,(Symbol *)&local_90);
  dVar2 = extraout_XMM0_Qa;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    dVar2 = extraout_XMM0_Qa_00;
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
    dVar2 = extraout_XMM0_Qa_01;
  }
  dVar2 = mathiu::impl::pow((impl *)&local_90,dVar2,in_XMM1_Qa);
  mathiu::impl::pow((impl *)local_a0,dVar2,in_XMM1_Qa);
  EVar3 = mathiu::impl::operator*((impl *)&local_68,(ExprPtr *)&local_90,(ExprPtr *)local_a0);
  ex = EVar3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
    ex._M_pi = extraout_RDX;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._M_string_length);
    ex._M_pi = extraout_RDX_00;
  }
  mathiu::impl::toString_abi_cxx11_(&local_90,(impl *)&local_68,(ExprPtr *)ex._M_pi);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
            ((internal *)local_a0,"toString(e)","\"(^ x 5/6)\"",&local_90,(char (*) [10])"(^ x 5/6)"
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_a0[0] == (impl)0x0) {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int **)0x20d5b4;
    }
    else {
      message = (_func_int **)((_Alloc_hider *)&(local_98._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/auto-simplification.cpp"
               ,0x18e,(char *)message);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_90._M_dataplus._M_p + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._M_pi
                );
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(autoSimplification, power2)
{
    auto const f1o2 = fraction(1, 2);
    auto const f1o3 = fraction(1, 3);
    auto const x = symbol("x");
    auto const e = (x ^ f1o2) * (x ^ f1o3);
    EXPECT_EQ(toString(e), "(^ x 5/6)");
}